

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_dump_dotgraph.c
# Opt level: O0

void linkedlist_dump_dotgraph
               (s_linkedlist *linked_list,_func_char_ptr_void_ptr *fun_render_node_element,
               int file_desc)

{
  int iVar1;
  char *__ptr;
  char *element;
  char *pcStack_30;
  int len;
  char *buffer;
  s_linkedlist_node *node;
  _func_char_ptr_void_ptr *p_Stack_18;
  int file_desc_local;
  _func_char_ptr_void_ptr *fun_render_node_element_local;
  s_linkedlist *linked_list_local;
  
  buffer = (char *)linked_list->head;
  pcStack_30 = (char *)0x0;
  node._4_4_ = file_desc;
  p_Stack_18 = fun_render_node_element;
  fun_render_node_element_local = (_func_char_ptr_void_ptr *)linked_list;
  write(file_desc,"digraph linkedlist {\n",0x15);
  for (; buffer != (char *)0x0; buffer = *(char **)(buffer + 8)) {
    if (p_Stack_18 == (_func_char_ptr_void_ptr *)0x0) {
      iVar1 = asprintf(&stack0xffffffffffffffd0,"\"%p\" [shape=box label=\"<%p>\n\n%p\"];\n",buffer,
                       buffer,*(undefined8 *)(buffer + 0x10));
      write(node._4_4_,pcStack_30,(long)iVar1);
      free(pcStack_30);
    }
    else {
      __ptr = (*p_Stack_18)(*(void **)(buffer + 0x10));
      iVar1 = asprintf(&stack0xffffffffffffffd0,"\"%p\" [shape=box label=\"<%p>\n\n%s\"];\n",buffer,
                       buffer,__ptr);
      write(node._4_4_,pcStack_30,(long)iVar1);
      free(pcStack_30);
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
    }
    if (*(long *)buffer != 0) {
      iVar1 = asprintf(&stack0xffffffffffffffd0,"\"%p\" -> \"%p\";\n",buffer,*(undefined8 *)buffer);
      write(node._4_4_,pcStack_30,(long)iVar1);
      free(pcStack_30);
    }
    if (*(long *)(buffer + 8) != 0) {
      iVar1 = asprintf(&stack0xffffffffffffffd0,"\"%p\" -> \"%p\";\n",buffer,
                       *(undefined8 *)(buffer + 8));
      write(node._4_4_,pcStack_30,(long)iVar1);
      free(pcStack_30);
    }
  }
  write(node._4_4_,"}\n",2);
  return;
}

Assistant:

void linkedlist_dump_dotgraph(s_linkedlist *linked_list, char *(*fun_render_node_element)(void *), int file_desc) {
    s_linkedlist_node *node   = linked_list->head;
    char              *buffer = NULL;
    int               len     = 0;

    write(file_desc, "digraph linkedlist {\n", 21);
    while (node != NULL) {
        if (fun_render_node_element != NULL) {
            char *element = fun_render_node_element(node->element);
            len = asprintf(&buffer, "\"%p\" [shape=box label=\"<%p>\n\n%s\"];\n", node, node, element);
            write(file_desc, buffer, len);

            free(buffer);
            if (element != NULL) {
                free(element);
            }
        } else {
            len = asprintf(&buffer, "\"%p\" [shape=box label=\"<%p>\n\n%p\"];\n", node, node, node->element);
            write(file_desc, buffer, len);

            free(buffer);
        }

        if (node->previous != NULL) {
            len = asprintf(&buffer, "\"%p\" -> \"%p\";\n", node, node->previous);
            write(file_desc, buffer, len);

            free(buffer);
        }

        if (node->next != NULL) {
            len = asprintf(&buffer, "\"%p\" -> \"%p\";\n", node, node->next);
            write(file_desc, buffer, len);

            free(buffer);
        }

        node = node->next;
    }

    write(file_desc, "}\n", 2);
}